

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void vpbroadcastb2(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  uint uVar2;
  Int32 IVar3;
  
  if (((((pMyDisasm->Reserved_).EVEX.state != '\x01') || ((pMyDisasm->Reserved_).VEX.pp != '\x01'))
      || ((pMyDisasm->Reserved_).EVEX.W != '\0')) ||
     (uVar2 = (uint)(*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6),
     (pMyDisasm->Reserved_).MOD_ = uVar2, uVar2 != 3)) {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
    return;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpbroadcastb",0xd);
  if ((pMyDisasm->Reserved_).VEX.vvvv != '\x0f') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
  (pMyDisasm->Instruction).Category = 0x140000;
  UVar1 = (pMyDisasm->Reserved_).VEX.L;
  if (UVar1 == '\0') {
    IVar3 = 4;
  }
  else if (UVar1 == '\x01') {
    IVar3 = 8;
  }
  else {
    IVar3 = 0x10;
    if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') goto LAB_0013173e;
  }
  (pMyDisasm->Reserved_).Register_ = IVar3;
LAB_0013173e:
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).Register_ = 0;
  (pMyDisasm->Reserved_).OperandSize = 8;
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  if ((pMyDisasm->Reserved_).MOD_ != 3) {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ vpbroadcastb2(PDISASM pMyDisasm)
{
  UInt8* modrm;
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 0) {
        modrm = (UInt8*) (GV.EIP_ + 1);
        GV.MOD_ = (*modrm >> 6) & 0x3;
        if (GV.MOD_ != 3) {
          failDecode(pMyDisasm);
          return;
        }
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpbroadcastb");
        #endif
        if (GV.VEX.vvvv != 15) GV.ERROR_OPCODE = UD_;
        GV.EVEX.tupletype = TUPLE1_SCALAR;
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
        if (GV.VEX.L == 0) {
          GV.Register_ = SSE_REG;
        }
        else if (GV.VEX.L == 0x1) {
          GV.Register_ = AVX_REG;
        }
        else if (GV.EVEX.LL == 0x2) {
          GV.Register_ = AVX512_REG;
        }
        decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
        GV.Register_ = 0;
        GV.OperandSize = 8;
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        if (GV.MOD_ != 3) GV.ERROR_OPCODE = UD_;
        GV.EIP_ += GV.DECALAGE_EIP+2;
      }
      else {
        failDecode(pMyDisasm);
      }

    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}